

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NULL.c
# Opt level: O0

int NULL_print(asn_TYPE_descriptor_t *td,void *sptr,int ilevel,asn_app_consume_bytes_f *cb,
              void *app_key)

{
  int iVar1;
  code *in_RCX;
  long in_RSI;
  undefined8 in_R8;
  int local_4;
  
  if (in_RSI == 0) {
    iVar1 = (*in_RCX)("<absent>",8,in_R8);
    local_4 = 0;
    if (iVar1 < 0) {
      local_4 = -1;
    }
  }
  else {
    iVar1 = (*in_RCX)("<present>",9,in_R8);
    local_4 = 0;
    if (iVar1 < 0) {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

int
NULL_print(asn_TYPE_descriptor_t *td, const void *sptr, int ilevel,
	asn_app_consume_bytes_f *cb, void *app_key) {

	(void)td;	/* Unused argument */
	(void)ilevel;	/* Unused argument */

	if(sptr) {
		return (cb("<present>", 9, app_key) < 0) ? -1 : 0;
	} else {
		return (cb("<absent>", 8, app_key) < 0) ? -1 : 0;
	}
}